

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonIO.cc
# Opt level: O2

Exception * __thiscall
avro::json::JsonParser::unexpected(Exception *__return_storage_ptr__,JsonParser *this,uchar c)

{
  ostream *poVar1;
  char cVar2;
  byte bVar3;
  ostringstream oss;
  string local_1b0;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"Unexpected character in json ");
  cVar2 = (c >> 4) + 0x57;
  if (c < 0xa0) {
    cVar2 = (c >> 4) + 0x30;
  }
  poVar1 = std::operator<<(poVar1,cVar2);
  bVar3 = c & 0xf;
  cVar2 = bVar3 + 0x57;
  if (bVar3 < 10) {
    cVar2 = bVar3 + 0x30;
  }
  std::operator<<(poVar1,cVar2);
  std::__cxx11::stringbuf::str();
  Exception::Exception(__return_storage_ptr__,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

Exception JsonParser::unexpected(unsigned char c)
{
    std::ostringstream oss;
    oss << "Unexpected character in json " << toHex(c / 16) << toHex(c % 16);
    return Exception(oss.str());
}